

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

GLuint make_shader_program(char *vs_text,char *fs_text)

{
  GLchar local_2038 [8];
  char info_log [8192];
  GLsizei local_2c;
  GLuint local_28;
  GLsizei log_length;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLint program_ok;
  GLuint program;
  char *fs_text_local;
  char *vs_text_local;
  
  vertex_shader = 0;
  log_length = 0;
  local_28 = 0;
  _program_ok = fs_text;
  fs_text_local = vs_text;
  log_length = make_shader(0x8b31,vs_text);
  if (log_length == 0) {
    fprintf(_stderr,"ERROR: Unable to load vertex shader\n");
  }
  else {
    local_28 = make_shader(0x8b30,_program_ok);
    if (local_28 == 0) {
      fprintf(_stderr,"ERROR: Unable to load fragment shader\n");
      (*glad_glDeleteShader)(log_length);
    }
    else {
      vertex_shader = (*glad_glCreateProgram)();
      if (vertex_shader != 0) {
        (*glad_glAttachShader)(vertex_shader,log_length);
        (*glad_glAttachShader)(vertex_shader,local_28);
        (*glad_glLinkProgram)(vertex_shader);
        (*glad_glGetProgramiv)(vertex_shader,0x8b82,(GLint *)&fragment_shader);
        if (fragment_shader != 1) {
          fprintf(_stderr,"ERROR, failed to link shader program\n");
          (*glad_glGetProgramInfoLog)(vertex_shader,0x2000,&local_2c,local_2038);
          fprintf(_stderr,"ERROR: \n%s\n\n",local_2038);
          (*glad_glDeleteProgram)(vertex_shader);
          (*glad_glDeleteShader)(local_28);
          (*glad_glDeleteShader)(log_length);
          vertex_shader = 0;
        }
      }
    }
  }
  return vertex_shader;
}

Assistant:

static GLuint make_shader_program(const char* vs_text, const char* fs_text)
{
    GLuint program = 0u;
    GLint program_ok;
    GLuint vertex_shader = 0u;
    GLuint fragment_shader = 0u;
    GLsizei log_length;
    char info_log[8192];

    vertex_shader = make_shader(GL_VERTEX_SHADER, vs_text);
    if (vertex_shader != 0u)
    {
        fragment_shader = make_shader(GL_FRAGMENT_SHADER, fs_text);
        if (fragment_shader != 0u)
        {
            /* make the program that connect the two shader and link it */
            program = glCreateProgram();
            if (program != 0u)
            {
                /* attach both shader and link */
                glAttachShader(program, vertex_shader);
                glAttachShader(program, fragment_shader);
                glLinkProgram(program);
                glGetProgramiv(program, GL_LINK_STATUS, &program_ok);

                if (program_ok != GL_TRUE)
                {
                    fprintf(stderr, "ERROR, failed to link shader program\n");
                    glGetProgramInfoLog(program, 8192, &log_length, info_log);
                    fprintf(stderr, "ERROR: \n%s\n\n", info_log);
                    glDeleteProgram(program);
                    glDeleteShader(fragment_shader);
                    glDeleteShader(vertex_shader);
                    program = 0u;
                }
            }
        }
        else
        {
            fprintf(stderr, "ERROR: Unable to load fragment shader\n");
            glDeleteShader(vertex_shader);
        }
    }
    else
    {
        fprintf(stderr, "ERROR: Unable to load vertex shader\n");
    }
    return program;
}